

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::addSubCommand
          (MainBuilder *this,StringPtr name,
          Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
          *getSubParser,StringPtr helpText)

{
  bool bVar1;
  Impl *pIVar2;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> *pFVar3;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_SubCommand>_>::value,_pair<iterator,_bool>_>
  _Var4;
  Fault local_148;
  Fault f_2;
  SubCommand local_130;
  pair<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> local_110;
  _Base_ptr local_e0;
  bool local_d8 [15];
  DebugExpression<bool> local_c9;
  DebugExpression<bool> _kjCondition_2;
  Fault f_1;
  undefined1 local_b8 [8];
  DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
  _kjCondition_1;
  Fault local_80;
  Fault f;
  size_t local_70;
  DebugExpression<unsigned_long> local_68;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
  *getSubParser_local;
  MainBuilder *this_local;
  StringPtr helpText_local;
  StringPtr name_local;
  
  helpText_local.content.ptr = (char *)helpText.content.size_;
  helpText_local.content.size_ = (size_t)name.content.ptr;
  _kjCondition._32_8_ = getSubParser;
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  local_70 = Vector<kj::MainBuilder::Impl::Arg>::size(&pIVar2->args);
  local_68 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_60,&local_68,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[50]>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x156,FAILED,"impl->args.size() == 0",
               "_kjCondition,\"cannot have sub-commands when expecting arguments\"",
               (DebugComparison<unsigned_long,_int> *)local_60,
               (char (*) [50])"cannot have sub-commands when expecting arguments");
    kj::_::Debug::Fault::fatal(&local_80);
  }
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  f_1.exception =
       (Exception *)
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&pIVar2->finalCallback);
  kj::_::DebugExpression<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&>::operator==
            ((DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
              *)local_b8,
             (DebugExpression<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&> *)&f_1,
             (None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity()>>&,kj::None_const&>&,char_const(&)[57]>
              ((Fault *)&stack0xffffffffffffff38,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x158,FAILED,"impl->finalCallback == kj::none",
               "_kjCondition,\"cannot have a final callback when accepting sub-commands\"",
               (DebugComparison<kj::Maybe<kj::Function<kj::MainBuilder::Validity_()>_>_&,_const_kj::None_&>
                *)local_b8,(char (*) [57])"cannot have a final callback when accepting sub-commands"
              );
    kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff38);
  }
  pIVar2 = Own<kj::MainBuilder::Impl,_std::nullptr_t>::operator->(&this->impl);
  pFVar3 = mv<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>>
                     (getSubParser);
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Function
            (&local_130.func,pFVar3);
  local_130.helpText.content.size_ = (size_t)helpText_local.content.ptr;
  local_130.helpText.content.ptr = helpText.content.ptr;
  std::make_pair<kj::StringPtr&,kj::MainBuilder::Impl::SubCommand>
            (&local_110,(StringPtr *)&helpText_local.content.size_,&local_130);
  _Var4 = std::
          map<kj::StringPtr,kj::MainBuilder::Impl::SubCommand,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
          ::insert<std::pair<kj::StringPtr,kj::MainBuilder::Impl::SubCommand>>
                    ((map<kj::StringPtr,kj::MainBuilder::Impl::SubCommand,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
                      *)&pIVar2->subCommands,&local_110);
  f_2.exception = (Exception *)_Var4.first._M_node;
  local_d8[0] = _Var4.second;
  local_e0 = (_Base_ptr)f_2.exception;
  local_c9 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_d8);
  std::pair<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>::~pair(&local_110);
  Impl::SubCommand::~SubCommand(&local_130);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_c9);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22],kj::StringPtr&>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/main.c++"
               ,0x15c,FAILED,
               "impl->subCommands.insert(std::make_pair( name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second"
               ,"_kjCondition,\"duplicate sub-command\", name",&local_c9,
               (char (*) [22])"duplicate sub-command",(StringPtr *)&helpText_local.content.size_);
    kj::_::Debug::Fault::fatal(&local_148);
  }
  return this;
}

Assistant:

MainBuilder& MainBuilder::addSubCommand(StringPtr name, Function<MainFunc()> getSubParser,
                                        StringPtr helpText) {
  KJ_REQUIRE(impl->args.size() == 0, "cannot have sub-commands when expecting arguments");
  KJ_REQUIRE(impl->finalCallback == kj::none,
             "cannot have a final callback when accepting sub-commands");
  KJ_REQUIRE(
      impl->subCommands.insert(std::make_pair(
          name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second,
      "duplicate sub-command", name);
  return *this;
}